

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t zeGetDriverProcAddrTable(ze_api_version_t version,ze_driver_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_driver_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnGet = driver::zeDriverGet;
      pDdiTable->pfnGetApiVersion = driver::zeDriverGetApiVersion;
      pDdiTable->pfnGetProperties = driver::zeDriverGetProperties;
      pDdiTable->pfnGetIpcProperties = driver::zeDriverGetIpcProperties;
      pDdiTable->pfnGetExtensionProperties = driver::zeDriverGetExtensionProperties;
      pDdiTable->pfnGetExtensionFunctionAddress = driver::zeDriverGetExtensionFunctionAddress;
      pDdiTable->pfnRTASFormatCompatibilityCheckExt =
           driver::zeDriverRTASFormatCompatibilityCheckExt;
      pDdiTable->pfnGetLastErrorDescription = driver::zeDriverGetLastErrorDescription;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetDriverProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_driver_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGet                                    = driver::zeDriverGet;

    pDdiTable->pfnGetApiVersion                          = driver::zeDriverGetApiVersion;

    pDdiTable->pfnGetProperties                          = driver::zeDriverGetProperties;

    pDdiTable->pfnGetIpcProperties                       = driver::zeDriverGetIpcProperties;

    pDdiTable->pfnGetExtensionProperties                 = driver::zeDriverGetExtensionProperties;

    pDdiTable->pfnGetExtensionFunctionAddress            = driver::zeDriverGetExtensionFunctionAddress;

    pDdiTable->pfnRTASFormatCompatibilityCheckExt        = driver::zeDriverRTASFormatCompatibilityCheckExt;

    pDdiTable->pfnGetLastErrorDescription                = driver::zeDriverGetLastErrorDescription;

    return result;
}